

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlBufferWriteChar(void)

{
  int iVar1;
  int iVar2;
  xmlBufferPtr val;
  char *val_00;
  int local_2c;
  int n_string;
  char *string;
  int n_buf;
  xmlBufferPtr buf;
  int mem_base;
  int test_ret;
  
  buf._4_4_ = 0;
  for (string._4_4_ = 0; (int)string._4_4_ < 3; string._4_4_ = string._4_4_ + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlBufferPtr(string._4_4_,0);
      val_00 = gen_const_char_ptr(local_2c,1);
      xmlBufferWriteChar(val,val_00);
      call_tests = call_tests + 1;
      des_xmlBufferPtr(string._4_4_,val,0);
      des_const_char_ptr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteChar",(ulong)(uint)(iVar2 - iVar1));
        buf._4_4_ = buf._4_4_ + 1;
        printf(" %d",(ulong)string._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return buf._4_4_;
}

Assistant:

static int
test_xmlBufferWriteChar(void) {
    int test_ret = 0;

    int mem_base;
    xmlBufferPtr buf; /* the XML buffer output */
    int n_buf;
    char * string; /* the string to add */
    int n_string;

    for (n_buf = 0;n_buf < gen_nb_xmlBufferPtr;n_buf++) {
    for (n_string = 0;n_string < gen_nb_const_char_ptr;n_string++) {
        mem_base = xmlMemBlocks();
        buf = gen_xmlBufferPtr(n_buf, 0);
        string = gen_const_char_ptr(n_string, 1);

        xmlBufferWriteChar(buf, (const char *)string);
        call_tests++;
        des_xmlBufferPtr(n_buf, buf, 0);
        des_const_char_ptr(n_string, (const char *)string, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlBufferWriteChar",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_string);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}